

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O1

PHYSFS_sint64 ZIP_read(PHYSFS_Io *_io,void *buf,PHYSFS_uint64 len)

{
  ZIPfileinfo *finfo;
  ZIPentry *pZVar1;
  bool bVar2;
  mz_ulong mVar3;
  int rc;
  PHYSFS_sint64 PVar4;
  char cVar5;
  PHYSFS_uint64 len_00;
  PHYSFS_sint64 PVar6;
  PHYSFS_uint64 len_01;
  
  finfo = (ZIPfileinfo *)_io->opaque;
  pZVar1 = finfo->entry;
  len_01 = pZVar1->uncompressed_size - (ulong)finfo->uncompressed_position;
  if ((long)len <= (long)len_01) {
    len_01 = len;
  }
  if (len_01 == 0) {
    PVar6 = 0;
  }
  else {
    if (pZVar1->compression_method == 0) {
      PVar6 = zip_read_decrypt(finfo,buf,len_01);
    }
    else {
      (finfo->stream).next_out = (uchar *)buf;
      (finfo->stream).avail_out = (uint)len_01;
      PVar6 = 0;
      do {
        if ((long)len_01 <= PVar6) break;
        mVar3 = (finfo->stream).total_out;
        if ((finfo->stream).avail_in == 0) {
          len_00 = pZVar1->compressed_size - (ulong)finfo->compressed_position;
          bVar2 = true;
          if ((long)len_00 < 1) {
            cVar5 = '\0';
          }
          else {
            if (0x3fff < (long)len_00) {
              len_00 = 0x4000;
            }
            PVar4 = zip_read_decrypt(finfo,finfo->buffer,len_00);
            cVar5 = '\0';
            if (PVar4 < 1) {
              cVar5 = '\x05';
              bVar2 = false;
            }
            else {
              finfo->compressed_position = finfo->compressed_position + (uint)PVar4;
              (finfo->stream).next_in = finfo->buffer;
              (finfo->stream).avail_in = (uint)PVar4;
            }
          }
          if (bVar2) goto LAB_001196c6;
        }
        else {
LAB_001196c6:
          rc = mz_inflate(&finfo->stream,2);
          zlib_err(rc);
          PVar6 = (PVar6 - (ulong)(uint)mVar3) + (finfo->stream).total_out;
          cVar5 = (rc != 0) * '\x05';
        }
      } while (cVar5 == '\0');
    }
    if (0 < PVar6) {
      finfo->uncompressed_position = finfo->uncompressed_position + (int)PVar6;
    }
  }
  return PVar6;
}

Assistant:

static PHYSFS_sint64 ZIP_read(PHYSFS_Io *_io, void *buf, PHYSFS_uint64 len)
{
    ZIPfileinfo *finfo = (ZIPfileinfo *) _io->opaque;
    ZIPentry *entry = finfo->entry;
    PHYSFS_sint64 retval = 0;
    PHYSFS_sint64 maxread = (PHYSFS_sint64) len;
    PHYSFS_sint64 avail = entry->uncompressed_size -
                          finfo->uncompressed_position;

    if (avail < maxread)
        maxread = avail;

    BAIL_IF_ERRPASS(maxread == 0, 0);    /* quick rejection. */

    if (entry->compression_method == COMPMETH_NONE)
        retval = zip_read_decrypt(finfo, buf, maxread);
    else
    {
        finfo->stream.next_out = buf;
        finfo->stream.avail_out = (uInt) maxread;

        while (retval < maxread)
        {
            const PHYSFS_uint32 before = (PHYSFS_uint32) finfo->stream.total_out;
            int rc;

            if (finfo->stream.avail_in == 0)
            {
                PHYSFS_sint64 br;

                br = entry->compressed_size - finfo->compressed_position;
                if (br > 0)
                {
                    if (br > ZIP_READBUFSIZE)
                        br = ZIP_READBUFSIZE;

                    br = zip_read_decrypt(finfo, finfo->buffer, (PHYSFS_uint64) br);
                    if (br <= 0)
                        break;

                    finfo->compressed_position += (PHYSFS_uint32) br;
                    finfo->stream.next_in = finfo->buffer;
                    finfo->stream.avail_in = (unsigned int) br;
                } /* if */
            } /* if */

            rc = zlib_err(inflate(&finfo->stream, Z_SYNC_FLUSH));
            retval += (finfo->stream.total_out - before);

            if (rc != Z_OK)
                break;
        } /* while */
    } /* else */

    if (retval > 0)
        finfo->uncompressed_position += (PHYSFS_uint32) retval;

    return retval;
}